

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::FunctionProxy::SetCrossSiteDeferredFunctionType(FunctionProxy *this,ScriptFunctionType *type)

{
  FunctionInfo *pFVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ParseableFunctionInfo *this_00;
  
  if ((this->functionInfo).ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x537,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_0076a85e;
    *puVar4 = 0;
  }
  if ((((this->functionInfo).ptr)->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x538,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) goto LAB_0076a85e;
    *puVar4 = 0;
  }
  pFVar1 = (this->functionInfo).ptr;
  if (((pFVar1->functionBodyImpl).ptr == (FunctionProxy *)0x0) ||
     ((pFVar1->attributes & DeferredDeserialize) != None)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x851,"(HasParseableInfo())","HasParseableInfo()");
    if (!bVar3) {
LAB_0076a85e:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  this_00 = GetParseableFunctionInfo(this);
  ParseableFunctionInfo::SetCrossSiteDeferredFunctionType(this_00,type);
  return;
}

Assistant:

void FunctionProxy::SetCrossSiteDeferredFunctionType(ScriptFunctionType * type)
    {
        Assert(HasParseableInfo());
        GetParseableFunctionInfo()->SetCrossSiteDeferredFunctionType(type);
    }